

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

StandardButton
showNewMessageBox(QWidget *parent,Icon icon,QString *title,QString *text,StandardButtons buttons,
                 StandardButton defaultButton)

{
  long lVar1;
  StandardButton SVar2;
  StandardButton SVar3;
  ButtonRole BVar4;
  int iVar5;
  QDialogButtonBox *this;
  QPushButton *button;
  int otherButtons;
  StandardButton button_00;
  long in_FS_OFFSET;
  QMessageBox msgBox;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((defaultButton &
      (uint)buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
            super_QFlagsStorage<QMessageBox::StandardButton>.i) == NoButton &&
      defaultButton != NoButton) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_004bad39:
      __stack_chk_fail();
    }
    SVar3 = QMessageBoxPrivate::showOldMessageBox
                      (parent,icon,title,text,
                       (int)buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
                            super_QFlagsStorage<QMessageBox::StandardButton>.i,
                       defaultButton | Default,0);
  }
  else {
    msgBox.super_QDialog.super_QWidget.data = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    msgBox.super_QDialog.super_QWidget._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    msgBox.super_QDialog.super_QWidget._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    msgBox.super_QDialog.super_QWidget._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    msgBox.super_QDialog.super_QWidget._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMessageBox::QMessageBox(&msgBox,icon,title,text,(StandardButtons)0x0,parent,(WindowFlags)0x103)
    ;
    this = (QDialogButtonBox *)
           QObject::findChild<QDialogButtonBox*>((QObject *)&msgBox,(FindChildOptions)0x1);
    SVar3 = FirstButton;
LAB_004bac78:
    if ((uint)SVar3 < 0x8000001) {
      SVar2 = SVar3 * 2;
      button_00 = SVar3 & (uint)buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
                                super_QFlagsStorage<QMessageBox::StandardButton>.i;
      SVar3 = SVar2;
      if ((button_00 != NoButton) &&
         (button = QMessageBox::addButton(&msgBox,button_00),
         *(long *)(msgBox.super_QDialog.super_QWidget._8_8_ + 800) == 0)) {
        if (defaultButton == NoButton) {
          BVar4 = QDialogButtonBox::buttonRole(this,&button->super_QAbstractButton);
          if (BVar4 != AcceptRole) goto LAB_004bac78;
        }
        else if (button_00 != defaultButton) goto LAB_004bac78;
        QMessageBox::setDefaultButton(&msgBox,button);
      }
      goto LAB_004bac78;
    }
    iVar5 = QDialog::exec(&msgBox.super_QDialog);
    if (iVar5 == -1) {
      SVar3 = Cancel;
    }
    else {
      SVar3 = QMessageBox::standardButton
                        (&msgBox,*(QAbstractButton **)
                                  (msgBox.super_QDialog.super_QWidget._8_8_ + 0x330));
    }
    QMessageBox::~QMessageBox(&msgBox);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_004bad39;
  }
  return SVar3;
}

Assistant:

static QMessageBox::StandardButton showNewMessageBox(QWidget *parent,
    QMessageBox::Icon icon,
    const QString& title, const QString& text,
    QMessageBox::StandardButtons buttons,
    QMessageBox::StandardButton defaultButton)
{
    // necessary for source compatibility with Qt 4.0 and 4.1
    // handles (Yes, No) and (Yes|Default, No)
    if (defaultButton && !(buttons & defaultButton)) {
        const int defaultButtons = defaultButton | QMessageBox::Default;
        const int otherButtons = buttons.toInt();
        const int ret = QMessageBoxPrivate::showOldMessageBox(parent, icon, title,
                                                              text, otherButtons,
                                                              defaultButtons, 0);
        return static_cast<QMessageBox::StandardButton>(ret);
    }

    QMessageBox msgBox(icon, title, text, QMessageBox::NoButton, parent);
    QDialogButtonBox *buttonBox = msgBox.findChild<QDialogButtonBox*>();
    Q_ASSERT(buttonBox != nullptr);

    uint mask = QMessageBox::FirstButton;
    while (mask <= QMessageBox::LastButton) {
        uint sb = buttons & mask;
        mask <<= 1;
        if (!sb)
            continue;
        QPushButton *button = msgBox.addButton((QMessageBox::StandardButton)sb);
        // Choose the first accept role as the default
        if (msgBox.defaultButton())
            continue;
        if ((defaultButton == QMessageBox::NoButton && buttonBox->buttonRole(button) == QDialogButtonBox::AcceptRole)
            || (defaultButton != QMessageBox::NoButton && sb == uint(defaultButton)))
            msgBox.setDefaultButton(button);
    }
    if (msgBox.exec() == -1)
        return QMessageBox::Cancel;
    return msgBox.standardButton(msgBox.clickedButton());
}